

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall runtime::VirtualMachine::CastToInt(VirtualMachine *this)

{
  int iVar1;
  __buckets_ptr __nptr;
  element_type *peVar2;
  __buckets_ptr pp_Var3;
  anon_union_8_6_52c89740_for_Variable_1 aVar4;
  anon_union_8_6_52c89740_for_Variable_1 extraout_RDX;
  undefined8 uVar5;
  Variable v;
  Variable VVar6;
  string local_50;
  
  VVar6 = popOpStack(this);
  aVar4 = VVar6.field_1;
  switch(VVar6.type) {
  case Undefined:
  case Boolean:
  case Object:
  case Function:
    uVar5 = 0;
    aVar4.integerValue = 0;
    break;
  case Float:
switchD_00117482_caseD_3:
    aVar4.integerValue = (int64_t)aVar4.doubleValue;
  case Integer:
    uVar5 = 1;
    break;
  case String:
    __nptr = ((aVar4.objectValue)->properties)._M_h._M_buckets;
    pp_Var3 = (__buckets_ptr)__errno_location();
    iVar1 = *(int *)pp_Var3;
    *(int *)pp_Var3 = 0;
    aVar4.stringValue = (string *)strtoll((char *)__nptr,&local_50,10);
    if ((__buckets_ptr)local_50._M_dataplus._M_p == __nptr) {
      uVar5 = std::__throw_invalid_argument("stoll");
      if ((__buckets_ptr)local_50._M_dataplus._M_p != pp_Var3) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar5);
    }
    if (*(int *)pp_Var3 == 0) {
      *(int *)pp_Var3 = iVar1;
    }
    else if (*(int *)pp_Var3 == 0x22) {
      std::__throw_out_of_range("stoll");
      aVar4 = extraout_RDX;
      goto switchD_00117482_caseD_3;
    }
    VVar6.field_1.integerValue = aVar4.integerValue;
    VVar6._0_8_ = 1;
    pushOpStack(this,VVar6);
    goto LAB_001174ee;
  default:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Unknown varible type at variableEquals","");
    panic(this,&local_50);
  }
  v.field_1.integerValue = aVar4.integerValue;
  v._0_8_ = uVar5;
  pushOpStack(this,v);
LAB_001174ee:
  peVar2 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2->programCounter = peVar2->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::CastToInt() {
  Variable top = this->popOpStack();

  switch (top.type) {
    case VariableType::Integer: {
      this->pushInteger(top.integerValue);
      break;
    }
    case VariableType::Float: {
      this->pushInteger(static_cast<std::int64_t>(top.doubleValue));
      break;
    }
    case VariableType::Function: {
      this->pushUndefined();
      break;
    }
    case VariableType::Object: {
      this->pushUndefined();
      break;
    }
    case VariableType::String: {
      try {
        std::int64_t val = std::stoll(*top.stringValue);
        this->pushInteger(val);

      } catch (...) {
        this->pushUndefined();
      }
      break;
    }
    case VariableType::Undefined: {
      this->pushUndefined();
      break;
    }
    case VariableType::Boolean: {
      this->pushUndefined();
      break;
    }
    default: {
      this->panic("Unknown varible type at variableEquals");
    }
  }

  this->advance();
}